

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O2

ostream * pstack::Procman::operator<<(ostream *os,JSON<pstack::Procman::FileEntry,_char> *j)

{
  ostream *poVar1;
  JObject *pJVar2;
  JObject local_30;
  char local_1b [3];
  
  local_30.sep = "";
  local_30.os = os;
  std::operator<<(os,"{ ");
  local_1b[0] = '\0';
  pJVar2 = JObject::field<char[6],unsigned_long,char>
                     (&local_30,(char (*) [6])"start",&j->object->start,local_1b);
  local_1b[1] = 0;
  pJVar2 = JObject::field<char[4],unsigned_long,char>
                     (pJVar2,(char (*) [4])0x143eac,&j->object->end,local_1b + 1);
  local_1b[2] = 0;
  pJVar2 = JObject::field<char[8],unsigned_long,char>
                     (pJVar2,(char (*) [8])"fileOff",&j->object->fileOff,local_1b + 2);
  poVar1 = pJVar2->os;
  JObject::~JObject(&local_30);
  return poVar1;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<pstack::Procman::FileEntry> &j) {
    return JObject(os)
        .field("start", j.object.start)
        .field("end", j.object.end)
        .field("fileOff", j.object.fileOff);
}